

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudio_CreateMasteringVoice
                   (FAudio *audio,FAudioMasteringVoice **ppMasteringVoice,uint32_t InputChannels,
                   uint32_t InputSampleRate,uint32_t Flags,uint32_t DeviceIndex,
                   FAudioEffectChain *pEffectChain)

{
  code *pcVar1;
  uint32_t uVar2;
  void *pvVar3;
  FAudioMutex pvVar4;
  int in_ECX;
  uint in_EDX;
  long *in_RSI;
  FAudio *in_RDI;
  undefined4 in_R8D;
  SDL_AssertState sdl_assert_state;
  FAudioDeviceDetails details;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  int in_stack_fffffffffffffba8;
  uint32_t in_stack_fffffffffffffbac;
  FAudioVoice *in_stack_fffffffffffffbb0;
  void **in_stack_fffffffffffffc10;
  uint32_t *in_stack_fffffffffffffc18;
  FAudioWaveFormatExtensible *in_stack_fffffffffffffc20;
  uint32_t in_stack_fffffffffffffc28;
  uint32_t in_stack_fffffffffffffc2c;
  FAudio *in_stack_fffffffffffffc30;
  FAudioEffectChain *in_stack_fffffffffffffc50;
  FAudioVoice *in_stack_fffffffffffffc58;
  ushort local_4e;
  int local_4c;
  uint32_t local_4;
  
  do {
    if (in_RDI->master == (FAudioMasteringVoice *)0x0) goto LAB_001269cf;
    in_stack_fffffffffffffba8 =
         SDL_ReportAssertion(&FAudio_CreateMasteringVoice::sdl_assert_data,
                             "FAudio_CreateMasteringVoice",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                             ,0x2ae);
  } while (in_stack_fffffffffffffba8 == 0);
  if (in_stack_fffffffffffffba8 == 1) {
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return uVar2;
  }
LAB_001269cf:
  uVar2 = FAudio_GetDeviceDetails
                    ((FAudio *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                     (FAudioDeviceDetails *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  if (uVar2 == 0) {
    pvVar3 = (*in_RDI->pMalloc)(0x148);
    *in_RSI = (long)pvVar3;
    SDL_memset(*in_RSI,0,0x148);
    *(FAudio **)*in_RSI = in_RDI;
    *(undefined4 *)(*in_RSI + 0xc) = 2;
    *(undefined4 *)(*in_RSI + 8) = in_R8D;
    pvVar4 = FAudio_PlatformCreateMutex();
    *(FAudioMutex *)(*in_RSI + 0x98) = pvVar4;
    pvVar4 = FAudio_PlatformCreateMutex();
    *(FAudioMutex *)(*in_RSI + 0xc0) = pvVar4;
    *(undefined4 *)(*in_RSI + 0xa8) = 0x3f800000;
    if (in_EDX == 0) {
      in_EDX = (uint)local_4e;
    }
    *(uint *)(*in_RSI + 0xd8) = in_EDX;
    if (in_ECX == 0) {
      in_ECX = local_4c;
    }
    *(int *)(*in_RSI + 0xdc) = in_ECX;
    SDL_memset(*in_RSI + 0x10,0,0xc);
    FAudioVoice_SetEffectChain(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    in_RDI->master = (FAudioMasteringVoice *)*in_RSI;
    WriteWaveFormatExtensible
              ((FAudioWaveFormatExtensible *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba8,(FAudioGUID *)CONCAT44(in_EDX,in_ECX));
    FAudio_AddRef(in_RDI);
    FAudio_PlatformInit(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                        in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                        in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    if (in_RDI->platform == (void *)0x0) {
      FAudioVoice_DestroyVoice(in_stack_fffffffffffffbb0);
      *in_RSI = 0;
      local_4 = 0x88960004;
    }
    else {
      in_RDI->master->outputChannels = (uint)(in_RDI->mixFormat).Format.nChannels;
      (in_RDI->master->field_19).master.inputSampleRate = (in_RDI->mixFormat).Format.nSamplesPerSec;
      if (*(int *)(*in_RSI + 0xd8) != *(int *)(*in_RSI + 0xb8)) {
        pvVar3 = (*in_RDI->pMalloc)((ulong)in_RDI->updateSize * 4 * (ulong)*(uint *)(*in_RSI + 0xd8)
                                   );
        *(void **)(*in_RSI + 0xd0) = pvVar3;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0x88960001;
  }
  return local_4;
}

Assistant:

uint32_t FAudio_CreateMasteringVoice(
	FAudio *audio,
	FAudioMasteringVoice **ppMasteringVoice,
	uint32_t InputChannels,
	uint32_t InputSampleRate,
	uint32_t Flags,
	uint32_t DeviceIndex,
	const FAudioEffectChain *pEffectChain
) {
	FAudioDeviceDetails details;

	LOG_API_ENTER(audio)

	/* For now we only support one allocated master voice at a time */
	FAudio_assert(audio->master == NULL);

	if (FAudio_GetDeviceDetails(audio, DeviceIndex, &details) != 0)
	{
		return FAUDIO_E_INVALID_CALL;
	}

	*ppMasteringVoice = (FAudioMasteringVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppMasteringVoice, sizeof(FAudioMasteringVoice));
	(*ppMasteringVoice)->audio = audio;
	(*ppMasteringVoice)->type = FAUDIO_VOICE_MASTER;
	(*ppMasteringVoice)->flags = Flags;
	(*ppMasteringVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppMasteringVoice)->effectLock)
	(*ppMasteringVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppMasteringVoice)->volumeLock)

	/* Default Levels */
	(*ppMasteringVoice)->volume = 1.0f;

	/* Master Properties */
	(*ppMasteringVoice)->master.inputChannels = (InputChannels == FAUDIO_DEFAULT_CHANNELS) ?
		details.OutputFormat.Format.nChannels :
		InputChannels;
	(*ppMasteringVoice)->master.inputSampleRate = (InputSampleRate == FAUDIO_DEFAULT_SAMPLERATE) ?
		details.OutputFormat.Format.nSamplesPerSec :
		InputSampleRate;

	/* Sends/Effects */
	FAudio_zero(&(*ppMasteringVoice)->sends, sizeof(FAudioVoiceSends));
	FAudioVoice_SetEffectChain(*ppMasteringVoice, pEffectChain);

	/* This is now safe enough to assign */
	audio->master = *ppMasteringVoice;

	/* Build the device format.
	 * The most unintuitive part of this is the use of outputChannels
	 * instead of master.inputChannels. Bizarrely, the effect chain can
	 * dictate the _actual_ output channel count, and when the channel count
	 * mismatches, we have to add a staging buffer for effects to process on
	 * before ultimately copying the final result to the device. ARGH.
	 */
	WriteWaveFormatExtensible(
		&audio->mixFormat,
		audio->master->outputChannels,
		audio->master->master.inputSampleRate,
		&DATAFORMAT_SUBTYPE_IEEE_FLOAT
	);

	/* Platform Device */
	FAudio_AddRef(audio);
	FAudio_PlatformInit(
		audio,
		audio->initFlags,
		DeviceIndex,
		&audio->mixFormat,
		&audio->updateSize,
		&audio->platform
	);
	if (audio->platform == NULL)
	{
		FAudioVoice_DestroyVoice(*ppMasteringVoice);
		*ppMasteringVoice = NULL;

		/* Not the best code, but it's probably true? */
		return FAUDIO_E_DEVICE_INVALIDATED;
	}
	audio->master->outputChannels = audio->mixFormat.Format.nChannels;
	audio->master->master.inputSampleRate = audio->mixFormat.Format.nSamplesPerSec;

	/* Effect Chain Cache */
	if ((*ppMasteringVoice)->master.inputChannels != (*ppMasteringVoice)->outputChannels)
	{
		(*ppMasteringVoice)->master.effectCache = (float*) audio->pMalloc(
			sizeof(float) *
			audio->updateSize *
			(*ppMasteringVoice)->master.inputChannels
		);
	}

	LOG_API_EXIT(audio)
	return 0;
}